

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O3

QRect __thiscall QStyle::itemPixmapRect(QStyle *this,QRect *rect,int alignment,QPixmap *pixmap)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  double in_XMM1_Qa;
  QRect QVar8;
  
  iVar3 = (rect->x1).m_i;
  iVar4 = (rect->y1).m_i;
  iVar1 = (rect->x2).m_i;
  iVar5 = (rect->y2).m_i;
  dVar7 = (double)QPixmap::deviceIndependentSize();
  iVar6 = (int)in_XMM1_Qa;
  if ((char)alignment < '\0') {
    iVar5 = iVar5 - iVar4;
    iVar4 = (((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1) + iVar4) - iVar6 / 2;
  }
  else if ((alignment & 0x40U) != 0) {
    iVar4 = (iVar5 - iVar6) + 1;
  }
  iVar5 = (int)dVar7;
  if ((alignment & 2U) == 0) {
    if ((alignment & 4U) != 0) {
      iVar3 = (((iVar1 - iVar3) + 1) / 2 + iVar3) - iVar5 / 2;
      goto LAB_00348d72;
    }
    if ((alignment & 1U) != 0) goto LAB_00348d72;
    iVar2 = QGuiApplication::layoutDirection();
    if (iVar2 != 1) goto LAB_00348d72;
  }
  iVar3 = (iVar1 - iVar5) + 1;
LAB_00348d72:
  QVar8.x2.m_i = iVar3 + iVar5 + -1;
  QVar8.y1.m_i = iVar4;
  QVar8.x1.m_i = iVar3;
  QVar8.y2.m_i = iVar6 + iVar4 + -1;
  return QVar8;
}

Assistant:

QRect QStyle::itemPixmapRect(const QRect &rect, int alignment, const QPixmap &pixmap) const
{
    QRect result;
    int x, y, w, h;
    rect.getRect(&x, &y, &w, &h);

    QSizeF pixmapSize = pixmap.deviceIndependentSize();
    const int pixmapWidth = pixmapSize.width();
    const int pixmapHeight = pixmapSize.height();

    if ((alignment & Qt::AlignVCenter) == Qt::AlignVCenter)
        y += h/2 - pixmapHeight/2;
    else if ((alignment & Qt::AlignBottom) == Qt::AlignBottom)
        y += h - pixmapHeight;
    if ((alignment & Qt::AlignRight) == Qt::AlignRight)
        x += w - pixmapWidth;
    else if ((alignment & Qt::AlignHCenter) == Qt::AlignHCenter)
        x += w/2 - pixmapWidth/2;
    else if ((alignment & Qt::AlignLeft) != Qt::AlignLeft && QGuiApplication::isRightToLeft())
        x += w - pixmapWidth;
    result = QRect(x, y, pixmapWidth, pixmapHeight);
    return result;
}